

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O0

void gimage::rgbToHSV<float>
               (float *hue,float *sat,float *val,float red,float green,float blue,float maxval)

{
  float fVar1;
  float *pfVar2;
  float *in_RDX;
  float *in_RSI;
  float *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float vmax;
  float vmin;
  float delta;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30 [2];
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float *local_18;
  float *local_10;
  float *local_8;
  
  local_28 = in_XMM3_Da;
  local_24 = in_XMM2_Da;
  local_20 = in_XMM1_Da;
  local_1c = in_XMM0_Da;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  pfVar2 = std::min<float>(local_30,&local_38);
  local_30[0] = *pfVar2;
  local_3c = local_24;
  pfVar2 = std::min<float>(local_30,&local_3c);
  local_30[0] = *pfVar2;
  local_34 = local_1c;
  local_40 = local_20;
  pfVar2 = std::max<float>(&local_34,&local_40);
  local_34 = *pfVar2;
  local_44 = local_24;
  pfVar2 = std::max<float>(&local_34,&local_44);
  fVar1 = *pfVar2;
  *local_18 = fVar1 / local_28;
  local_30[0] = fVar1 - local_30[0];
  if (local_30[0] <= 0.0) {
    *local_8 = 0.0;
    *local_10 = 0.0;
  }
  else {
    if ((local_1c != fVar1) || (NAN(local_1c) || NAN(fVar1))) {
      if ((local_20 != fVar1) || (NAN(local_20) || NAN(fVar1))) {
        *local_8 = (local_1c - local_20) / local_30[0] + 4.0;
      }
      else {
        *local_8 = (local_24 - local_1c) / local_30[0] + 2.0;
      }
    }
    else {
      *local_8 = (local_20 - local_24) / local_30[0];
    }
    if (*local_8 <= 0.0 && *local_8 != 0.0) {
      *local_8 = *local_8 + 6.0;
    }
    *local_10 = local_30[0] / fVar1;
  }
  return;
}

Assistant:

void rgbToHSV(float &hue, float &sat, float &val, T red, T green, T blue, T maxval)
{
  float delta, vmin, vmax;

  vmin=static_cast<float>(red);
  vmin=std::min(vmin, static_cast<float>(green));
  vmin=std::min(vmin, static_cast<float>(blue));

  vmax=static_cast<float>(red);
  vmax=std::max(vmax, static_cast<float>(green));
  vmax=std::max(vmax, static_cast<float>(blue));

  val=vmax/maxval;
  delta=vmax-vmin;

  if (delta > 0)
  {
    if (red == vmax)
    {
      hue=(green-blue)/delta;
    }
    else if (green == vmax)
    {
      hue=2+(blue-red)/delta;
    }
    else
    {
      hue=4+(red-green)/delta;
    }

    if (hue < 0)
    {
      hue+=6;
    }

    sat=delta/vmax;
  }
  else
  {
    hue=0;
    sat=0;
  }
}